

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.cpp
# Opt level: O0

void __thiscall aeron::Subscription::~Subscription(Subscription *this)

{
  void *in_RDI;
  Subscription *unaff_retaddr;
  
  ~Subscription(unaff_retaddr);
  operator_delete(in_RDI);
  return;
}

Assistant:

Subscription::~Subscription()
{
    m_conductor.releaseSubscription(m_registrationId, std::atomic_load_explicit(&m_imageList, std::memory_order_acquire));
}